

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar19;
  Geometry *pGVar20;
  RTCIntersectArguments *pRVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  long lVar32;
  undefined4 uVar33;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  float fVar53;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar62;
  float fVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar70;
  float fVar72;
  undefined1 auVar68 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  undefined1 auVar69 [16];
  float fVar75;
  float fVar76;
  float fVar82;
  float fVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [16];
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar95;
  undefined1 auVar90 [16];
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar98;
  float fVar99;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 local_ad9;
  long local_ad8;
  int local_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  Scene *local_ab8;
  float fStack_ab0;
  float fStack_aac;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  NodeRef *local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined4 local_a58;
  undefined4 uStack_a54;
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  undefined1 local_a28 [8];
  float fStack_a20;
  float fStack_a1c;
  ulong local_a10;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_9a8;
  uint uStack_9a4;
  uint uStack_9a0;
  uint uStack_99c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  NodeRef stack [244];
  
  auVar29 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (local_a28._4_4_ = ray->tfar, 0.0 <= (float)local_a28._4_4_)) {
    local_a88 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar25 = (ray->org).field_0.m128[0];
    fVar26 = (ray->org).field_0.m128[1];
    fVar137 = (ray->org).field_0.m128[2];
    aVar19 = (ray->dir).field_0.field_1;
    fVar67 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar113 = 0.0;
    if (0.0 <= fVar67) {
      fVar113 = fVar67;
    }
    uVar41 = -(uint)(1e-18 <= ABS(aVar19.x));
    uVar42 = -(uint)(1e-18 <= ABS(aVar19.y));
    uVar46 = -(uint)(1e-18 <= ABS(aVar19.z));
    auVar68 = divps(_DAT_01feca10,(undefined1  [16])aVar19);
    fVar88 = (float)(~uVar41 & 0x5d5e0b6b | auVar68._0_4_ & uVar41);
    fVar93 = (float)(~uVar42 & 0x5d5e0b6b | auVar68._4_4_ & uVar42);
    fVar95 = (float)(~uVar46 & 0x5d5e0b6b | auVar68._8_4_ & uVar46);
    fVar65 = fVar88 * 0.99999964;
    fVar70 = fVar93 * 0.99999964;
    fVar72 = fVar95 * 0.99999964;
    fVar88 = fVar88 * 1.0000004;
    fVar93 = fVar93 * 1.0000004;
    fVar95 = fVar95 * 1.0000004;
    local_a90 = (ulong)(fVar65 < 0.0) << 4;
    local_a98 = (ulong)(fVar70 < 0.0) << 4 | 0x20;
    local_aa0 = (ulong)(fVar72 < 0.0) << 4 | 0x40;
    uVar38 = local_a90 ^ 0x10;
    uVar39 = local_a98 ^ 0x10;
    local_a80 = local_aa0 ^ 0x10;
    auVar68._4_4_ = fVar113;
    auVar68._0_4_ = fVar113;
    auVar68._8_4_ = fVar113;
    auVar68._12_4_ = fVar113;
    local_a28._0_4_ = local_a28._4_4_;
    fStack_a20 = (float)local_a28._4_4_;
    fStack_a1c = (float)local_a28._4_4_;
    uVar37 = local_a80;
    fVar67 = fVar137;
    fVar113 = fVar137;
    fVar133 = fVar137;
    local_a78 = uVar39;
    local_a70 = uVar38;
    local_a68 = fVar137;
    fStack_a64 = fVar137;
    fStack_a60 = fVar137;
    fStack_a5c = fVar137;
    do {
      if (local_a88 == stack) {
        return;
      }
      sVar35 = local_a88[-1].ptr;
      local_a88 = local_a88 + -1;
      do {
        if ((sVar35 & 8) == 0) {
          fVar108 = (ray->dir).field_0.m128[3];
          uVar31 = sVar35 & 0xfffffffffffffff0;
          pfVar6 = (float *)(uVar31 + 0x80 + local_a90);
          pfVar1 = (float *)(uVar31 + 0x20 + local_a90);
          auVar59._0_4_ = ((*pfVar6 * fVar108 + *pfVar1) - fVar25) * fVar65;
          auVar59._4_4_ = ((pfVar6[1] * fVar108 + pfVar1[1]) - fVar25) * fVar65;
          auVar59._8_4_ = ((pfVar6[2] * fVar108 + pfVar1[2]) - fVar25) * fVar65;
          auVar59._12_4_ = ((pfVar6[3] * fVar108 + pfVar1[3]) - fVar25) * fVar65;
          pfVar6 = (float *)(uVar31 + 0x80 + local_a98);
          pfVar1 = (float *)(uVar31 + 0x20 + local_a98);
          auVar59 = maxps(auVar68,auVar59);
          auVar80._0_4_ = ((*pfVar6 * fVar108 + *pfVar1) - fVar26) * fVar70;
          auVar80._4_4_ = ((pfVar6[1] * fVar108 + pfVar1[1]) - fVar26) * fVar70;
          auVar80._8_4_ = ((pfVar6[2] * fVar108 + pfVar1[2]) - fVar26) * fVar70;
          auVar80._12_4_ = ((pfVar6[3] * fVar108 + pfVar1[3]) - fVar26) * fVar70;
          pfVar6 = (float *)(uVar31 + 0x80 + local_aa0);
          pfVar1 = (float *)(uVar31 + 0x20 + local_aa0);
          auVar77._0_4_ = ((*pfVar6 * fVar108 + *pfVar1) - fVar137) * fVar72;
          auVar77._4_4_ = ((pfVar6[1] * fVar108 + pfVar1[1]) - fVar67) * fVar72;
          auVar77._8_4_ = ((pfVar6[2] * fVar108 + pfVar1[2]) - fVar113) * fVar72;
          auVar77._12_4_ = ((pfVar6[3] * fVar108 + pfVar1[3]) - fVar133) * fVar72;
          auVar77 = maxps(auVar80,auVar77);
          auVar59 = maxps(auVar59,auVar77);
          pfVar6 = (float *)(uVar31 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar31 + 0x20 + uVar38);
          auVar78._0_4_ = ((*pfVar6 * fVar108 + *pfVar1) - fVar25) * fVar88;
          auVar78._4_4_ = ((pfVar6[1] * fVar108 + pfVar1[1]) - fVar25) * fVar88;
          auVar78._8_4_ = ((pfVar6[2] * fVar108 + pfVar1[2]) - fVar25) * fVar88;
          auVar78._12_4_ = ((pfVar6[3] * fVar108 + pfVar1[3]) - fVar25) * fVar88;
          auVar77 = minps(_local_a28,auVar78);
          pfVar7 = (float *)(uVar31 + 0x80 + uVar39);
          pfVar1 = (float *)(uVar31 + 0x20 + uVar39);
          pfVar8 = (float *)(uVar31 + 0x80 + uVar37);
          pfVar6 = (float *)(uVar31 + 0x20 + uVar37);
          auVar79._0_4_ = ((*pfVar7 * fVar108 + *pfVar1) - fVar26) * fVar93;
          auVar79._4_4_ = ((pfVar7[1] * fVar108 + pfVar1[1]) - fVar26) * fVar93;
          auVar79._8_4_ = ((pfVar7[2] * fVar108 + pfVar1[2]) - fVar26) * fVar93;
          auVar79._12_4_ = ((pfVar7[3] * fVar108 + pfVar1[3]) - fVar26) * fVar93;
          auVar90._0_4_ = ((*pfVar8 * fVar108 + *pfVar6) - fVar137) * fVar95;
          auVar90._4_4_ = ((pfVar8[1] * fVar108 + pfVar6[1]) - fVar67) * fVar95;
          auVar90._8_4_ = ((pfVar8[2] * fVar108 + pfVar6[2]) - fVar113) * fVar95;
          auVar90._12_4_ = ((pfVar8[3] * fVar108 + pfVar6[3]) - fVar133) * fVar95;
          auVar80 = minps(auVar79,auVar90);
          auVar77 = minps(auVar77,auVar80);
          bVar40 = auVar59._0_4_ <= auVar77._0_4_;
          bVar22 = auVar59._4_4_ <= auVar77._4_4_;
          bVar23 = auVar59._8_4_ <= auVar77._8_4_;
          bVar24 = auVar59._12_4_ <= auVar77._12_4_;
          if (((uint)sVar35 & 7) == 6) {
            bVar40 = (fVar108 < *(float *)(uVar31 + 0xf0) && *(float *)(uVar31 + 0xe0) <= fVar108)
                     && bVar40;
            bVar22 = (fVar108 < *(float *)(uVar31 + 0xf4) && *(float *)(uVar31 + 0xe4) <= fVar108)
                     && bVar22;
            bVar23 = (fVar108 < *(float *)(uVar31 + 0xf8) && *(float *)(uVar31 + 0xe8) <= fVar108)
                     && bVar23;
            bVar24 = (fVar108 < *(float *)(uVar31 + 0xfc) && *(float *)(uVar31 + 0xec) <= fVar108)
                     && bVar24;
          }
          auVar60._0_4_ = (uint)bVar40 * -0x80000000;
          auVar60._4_4_ = (uint)bVar22 * -0x80000000;
          auVar60._8_4_ = (uint)bVar23 * -0x80000000;
          auVar60._12_4_ = (uint)bVar24 * -0x80000000;
          uVar33 = movmskps((int)unaff_RBX,auVar60);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar33);
        }
        if ((sVar35 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar30 = 4;
          }
          else {
            uVar31 = sVar35 & 0xfffffffffffffff0;
            lVar32 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            iVar30 = 0;
            sVar35 = *(size_t *)(uVar31 + lVar32 * 8);
            uVar34 = unaff_RBX - 1 & unaff_RBX;
            if (uVar34 != 0) {
              local_a88->ptr = sVar35;
              lVar32 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              uVar36 = uVar34 - 1;
              while( true ) {
                local_a88 = local_a88 + 1;
                sVar35 = *(size_t *)(uVar31 + lVar32 * 8);
                uVar36 = uVar36 & uVar34;
                if (uVar36 == 0) break;
                local_a88->ptr = sVar35;
                lVar32 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                uVar34 = uVar36 - 1;
              }
            }
          }
        }
        else {
          iVar30 = 6;
        }
      } while (iVar30 == 0);
      uVar31 = uVar37;
      if (iVar30 == 6) {
        iVar30 = 0;
        uVar34 = (ulong)((uint)sVar35 & 0xf) - 8;
        bVar40 = uVar34 != 0;
        if (bVar40) {
          uVar36 = sVar35 & 0xfffffffffffffff0;
          local_a10 = 0;
          do {
            local_ad8 = local_a10 * 0x140;
            fVar67 = (ray->dir).field_0.m128[3];
            pfVar9 = (float *)(uVar36 + 0x90 + local_ad8);
            pfVar1 = (float *)(uVar36 + local_ad8);
            pfVar10 = (float *)(uVar36 + 0xa0 + local_ad8);
            pfVar6 = (float *)(uVar36 + 0x10 + local_ad8);
            pfVar11 = (float *)(uVar36 + 0xb0 + local_ad8);
            pfVar7 = (float *)(uVar36 + 0x20 + local_ad8);
            pfVar12 = (float *)(uVar36 + 0xc0 + local_ad8);
            pfVar8 = (float *)(uVar36 + 0x30 + local_ad8);
            pfVar13 = (float *)(uVar36 + 0xd0 + local_ad8);
            pfVar2 = (float *)(uVar36 + 0x40 + local_ad8);
            pfVar14 = (float *)(uVar36 + 0xe0 + local_ad8);
            pfVar3 = (float *)(uVar36 + 0x50 + local_ad8);
            pfVar15 = (float *)(uVar36 + 0xf0 + local_ad8);
            pfVar4 = (float *)(uVar36 + 0x60 + local_ad8);
            pfVar16 = (float *)(uVar36 + 0x100 + local_ad8);
            pfVar5 = (float *)(uVar36 + 0x70 + local_ad8);
            pfVar17 = (float *)(uVar36 + 0x110 + local_ad8);
            pfVar18 = (float *)(uVar36 + 0x80 + local_ad8);
            fVar113 = (ray->org).field_0.m128[0];
            fVar137 = (ray->org).field_0.m128[1];
            fVar133 = (ray->org).field_0.m128[2];
            fVar124 = (*pfVar9 * fVar67 + *pfVar1) - fVar113;
            fVar126 = (pfVar9[1] * fVar67 + pfVar1[1]) - fVar113;
            fStack_a30 = (pfVar9[2] * fVar67 + pfVar1[2]) - fVar113;
            fStack_a2c = (pfVar9[3] * fVar67 + pfVar1[3]) - fVar113;
            fVar114 = (*pfVar10 * fVar67 + *pfVar6) - fVar137;
            fVar115 = (pfVar10[1] * fVar67 + pfVar6[1]) - fVar137;
            fStack_a40 = (pfVar10[2] * fVar67 + pfVar6[2]) - fVar137;
            fStack_a3c = (pfVar10[3] * fVar67 + pfVar6[3]) - fVar137;
            fVar66 = (*pfVar11 * fVar67 + *pfVar7) - fVar133;
            fVar71 = (pfVar11[1] * fVar67 + pfVar7[1]) - fVar133;
            fVar73 = (pfVar11[2] * fVar67 + pfVar7[2]) - fVar133;
            fVar74 = (pfVar11[3] * fVar67 + pfVar7[3]) - fVar133;
            fVar89 = (*pfVar12 * fVar67 + *pfVar8) - fVar113;
            fVar94 = (pfVar12[1] * fVar67 + pfVar8[1]) - fVar113;
            fVar96 = (pfVar12[2] * fVar67 + pfVar8[2]) - fVar113;
            fVar97 = (pfVar12[3] * fVar67 + pfVar8[3]) - fVar113;
            fVar140 = (*pfVar13 * fVar67 + *pfVar2) - fVar137;
            fVar142 = (pfVar13[1] * fVar67 + pfVar2[1]) - fVar137;
            fVar144 = (pfVar13[2] * fVar67 + pfVar2[2]) - fVar137;
            fVar146 = (pfVar13[3] * fVar67 + pfVar2[3]) - fVar137;
            fVar98 = (*pfVar14 * fVar67 + *pfVar3) - fVar133;
            fVar102 = (pfVar14[1] * fVar67 + pfVar3[1]) - fVar133;
            fVar104 = (pfVar14[2] * fVar67 + pfVar3[2]) - fVar133;
            fVar106 = (pfVar14[3] * fVar67 + pfVar3[3]) - fVar133;
            fVar109 = (*pfVar15 * fVar67 + *pfVar4) - fVar113;
            fVar111 = (pfVar15[1] * fVar67 + pfVar4[1]) - fVar113;
            fVar112 = (pfVar15[2] * fVar67 + pfVar4[2]) - fVar113;
            fVar113 = (pfVar15[3] * fVar67 + pfVar4[3]) - fVar113;
            fVar134 = (*pfVar16 * fVar67 + *pfVar5) - fVar137;
            fVar135 = (pfVar16[1] * fVar67 + pfVar5[1]) - fVar137;
            fVar136 = (pfVar16[2] * fVar67 + pfVar5[2]) - fVar137;
            fVar137 = (pfVar16[3] * fVar67 + pfVar5[3]) - fVar137;
            fVar130 = (fVar67 * *pfVar17 + *pfVar18) - fVar133;
            fVar131 = (fVar67 * pfVar17[1] + pfVar18[1]) - fVar133;
            fVar132 = (fVar67 * pfVar17[2] + pfVar18[2]) - fVar133;
            fVar133 = (fVar67 * pfVar17[3] + pfVar18[3]) - fVar133;
            fVar75 = fVar109 - fVar124;
            fVar82 = fVar111 - fVar126;
            fVar84 = fVar112 - fStack_a30;
            fVar86 = fVar113 - fStack_a2c;
            fVar99 = fVar134 - fVar114;
            fVar103 = fVar135 - fVar115;
            fVar105 = fVar136 - fStack_a40;
            fVar107 = fVar137 - fStack_a3c;
            fVar116 = fVar130 - fVar66;
            fVar118 = fVar131 - fVar71;
            fVar120 = fVar132 - fVar73;
            fVar122 = fVar133 - fVar74;
            fVar108 = (ray->dir).field_0.m128[0];
            fStack_ab0 = (ray->dir).field_0.m128[1];
            fStack_ac4 = (ray->dir).field_0.m128[2];
            fVar138 = (fVar99 * (fVar130 + fVar66) - fVar116 * (fVar134 + fVar114)) * fVar108 +
                      (fVar116 * (fVar109 + fVar124) - (fVar130 + fVar66) * fVar75) * fStack_ab0 +
                      ((fVar134 + fVar114) * fVar75 - (fVar109 + fVar124) * fVar99) * fStack_ac4;
            fVar139 = (fVar103 * (fVar131 + fVar71) - fVar118 * (fVar135 + fVar115)) * fVar108 +
                      (fVar118 * (fVar111 + fVar126) - (fVar131 + fVar71) * fVar82) * fStack_ab0 +
                      ((fVar135 + fVar115) * fVar82 - (fVar111 + fVar126) * fVar103) * fStack_ac4;
            fStack_a50 = (fVar105 * (fVar132 + fVar73) - fVar120 * (fVar136 + fStack_a40)) * fVar108
                         + (fVar120 * (fVar112 + fStack_a30) - (fVar132 + fVar73) * fVar84) *
                           fStack_ab0 +
                           ((fVar136 + fStack_a40) * fVar84 - (fVar112 + fStack_a30) * fVar105) *
                           fStack_ac4;
            fStack_a4c = (fVar107 * (fVar133 + fVar74) - fVar122 * (fVar137 + fStack_a3c)) * fVar108
                         + (fVar122 * (fVar113 + fStack_a2c) - (fVar133 + fVar74) * fVar86) *
                           fStack_ab0 +
                           ((fVar137 + fStack_a3c) * fVar86 - (fVar113 + fStack_a2c) * fVar107) *
                           fStack_ac4;
            fVar76 = fVar114 - fVar140;
            fVar83 = fVar115 - fVar142;
            fVar85 = fStack_a40 - fVar144;
            fVar87 = fStack_a3c - fVar146;
            fVar141 = fVar66 - fVar98;
            fVar143 = fVar71 - fVar102;
            fVar145 = fVar73 - fVar104;
            fVar147 = fVar74 - fVar106;
            local_a48 = (Ray *)CONCAT44(fVar115,fVar114);
            fVar53 = fVar124 - fVar89;
            fVar55 = fVar126 - fVar94;
            fVar56 = fStack_a30 - fVar96;
            fVar57 = fStack_a2c - fVar97;
            local_a38 = (RayQueryContext *)CONCAT44(fVar126,fVar124);
            auVar91._0_4_ =
                 (fVar76 * (fVar66 + fVar98) - fVar141 * (fVar114 + fVar140)) * fVar108 +
                 (fVar141 * (fVar124 + fVar89) - (fVar66 + fVar98) * fVar53) * fStack_ab0 +
                 ((fVar114 + fVar140) * fVar53 - (fVar124 + fVar89) * fVar76) * fStack_ac4;
            auVar91._4_4_ =
                 (fVar83 * (fVar71 + fVar102) - fVar143 * (fVar115 + fVar142)) * fVar108 +
                 (fVar143 * (fVar126 + fVar94) - (fVar71 + fVar102) * fVar55) * fStack_ab0 +
                 ((fVar115 + fVar142) * fVar55 - (fVar126 + fVar94) * fVar83) * fStack_ac4;
            auVar91._8_4_ =
                 (fVar85 * (fVar73 + fVar104) - fVar145 * (fStack_a40 + fVar144)) * fVar108 +
                 (fVar145 * (fStack_a30 + fVar96) - (fVar73 + fVar104) * fVar56) * fStack_ab0 +
                 ((fStack_a40 + fVar144) * fVar56 - (fStack_a30 + fVar96) * fVar85) * fStack_ac4;
            auVar91._12_4_ =
                 (fVar87 * (fVar74 + fVar106) - fVar147 * (fStack_a3c + fVar146)) * fVar108 +
                 (fVar147 * (fStack_a2c + fVar97) - (fVar74 + fVar106) * fVar57) * fStack_ab0 +
                 ((fStack_a3c + fVar146) * fVar57 - (fStack_a2c + fVar97) * fVar87) * fStack_ac4;
            fVar58 = fVar89 - fVar109;
            fVar62 = fVar94 - fVar111;
            fVar63 = fVar96 - fVar112;
            fVar64 = fVar97 - fVar113;
            fVar117 = fVar140 - fVar134;
            fVar119 = fVar142 - fVar135;
            fVar121 = fVar144 - fVar136;
            fVar123 = fVar146 - fVar137;
            fVar125 = fVar98 - fVar130;
            fVar127 = fVar102 - fVar131;
            fVar128 = fVar104 - fVar132;
            fVar129 = fVar106 - fVar133;
            auVar69._0_4_ =
                 (fVar117 * (fVar130 + fVar98) - fVar125 * (fVar134 + fVar140)) * fVar108 +
                 (fVar125 * (fVar109 + fVar89) - (fVar130 + fVar98) * fVar58) * fStack_ab0 +
                 ((fVar134 + fVar140) * fVar58 - (fVar109 + fVar89) * fVar117) * fStack_ac4;
            auVar69._4_4_ =
                 (fVar119 * (fVar131 + fVar102) - fVar127 * (fVar135 + fVar142)) * fVar108 +
                 (fVar127 * (fVar111 + fVar94) - (fVar131 + fVar102) * fVar62) * fStack_ab0 +
                 ((fVar135 + fVar142) * fVar62 - (fVar111 + fVar94) * fVar119) * fStack_ac4;
            auVar69._8_4_ =
                 (fVar121 * (fVar132 + fVar104) - fVar128 * (fVar136 + fVar144)) * fVar108 +
                 (fVar128 * (fVar112 + fVar96) - (fVar132 + fVar104) * fVar63) * fStack_ab0 +
                 ((fVar136 + fVar144) * fVar63 - (fVar112 + fVar96) * fVar121) * fStack_ac4;
            auVar69._12_4_ =
                 (fVar123 * (fVar133 + fVar106) - fVar129 * (fVar137 + fVar146)) * fVar108 +
                 (fVar129 * (fVar113 + fVar97) - (fVar133 + fVar106) * fVar64) * fStack_ab0 +
                 ((fVar137 + fVar146) * fVar64 - (fVar113 + fVar97) * fVar123) * fStack_ac4;
            auVar27._4_4_ = fVar139;
            auVar27._0_4_ = fVar138;
            auVar27._8_4_ = fStack_a50;
            auVar27._12_4_ = fStack_a4c;
            fVar89 = fVar138 + auVar91._0_4_ + auVar69._0_4_;
            fVar94 = fVar139 + auVar91._4_4_ + auVar69._4_4_;
            fVar96 = fStack_a50 + auVar91._8_4_ + auVar69._8_4_;
            fVar97 = fStack_a4c + auVar91._12_4_ + auVar69._12_4_;
            auVar59 = minps(auVar27,auVar91);
            auVar77 = minps(auVar59,auVar69);
            auVar59 = maxps(auVar27,auVar91);
            auVar59 = maxps(auVar59,auVar69);
            fVar67 = ABS(fVar89) * 1.1920929e-07;
            fVar113 = ABS(fVar94) * 1.1920929e-07;
            fVar137 = ABS(fVar96) * 1.1920929e-07;
            fVar133 = ABS(fVar97) * 1.1920929e-07;
            local_9a8 = auVar29._0_4_;
            uStack_9a4 = auVar29._4_4_;
            uStack_9a0 = auVar29._8_4_;
            uStack_99c = auVar29._12_4_;
            auVar110._0_4_ =
                 -(uint)(auVar59._0_4_ <= fVar67 || -fVar67 <= auVar77._0_4_) & local_9a8;
            auVar110._4_4_ =
                 -(uint)(auVar59._4_4_ <= fVar113 || -fVar113 <= auVar77._4_4_) & uStack_9a4;
            auVar110._8_4_ =
                 -(uint)(auVar59._8_4_ <= fVar137 || -fVar137 <= auVar77._8_4_) & uStack_9a0;
            auVar110._12_4_ =
                 -(uint)(auVar59._12_4_ <= fVar133 || -fVar133 <= auVar77._12_4_) & uStack_99c;
            iVar30 = movmskps((int)&local_ad9,auVar110);
            fVar137 = local_a68;
            fVar67 = fStack_a64;
            fVar113 = fStack_a60;
            fVar133 = fStack_a5c;
            if (iVar30 != 0) {
              uVar41 = -(uint)(ABS(fVar141 * fVar117) <= ABS(fVar116 * fVar76));
              uVar43 = -(uint)(ABS(fVar143 * fVar119) <= ABS(fVar118 * fVar83));
              uVar47 = -(uint)(ABS(fVar145 * fVar121) <= ABS(fVar120 * fVar85));
              uVar50 = -(uint)(ABS(fVar147 * fVar123) <= ABS(fVar122 * fVar87));
              uVar42 = -(uint)(ABS(fVar53 * fVar125) <= ABS(fVar75 * fVar141));
              uVar44 = -(uint)(ABS(fVar55 * fVar127) <= ABS(fVar82 * fVar143));
              uVar48 = -(uint)(ABS(fVar56 * fVar128) <= ABS(fVar84 * fVar145));
              uVar51 = -(uint)(ABS(fVar57 * fVar129) <= ABS(fVar86 * fVar147));
              uVar46 = -(uint)(ABS(fVar76 * fVar58) <= ABS(fVar99 * fVar53));
              uVar45 = -(uint)(ABS(fVar83 * fVar62) <= ABS(fVar103 * fVar55));
              uVar49 = -(uint)(ABS(fVar85 * fVar63) <= ABS(fVar105 * fVar56));
              uVar52 = -(uint)(ABS(fVar87 * fVar64) <= ABS(fVar107 * fVar57));
              auVar81._0_4_ = (uint)(fVar76 * fVar125 - fVar141 * fVar117) & uVar41;
              auVar81._4_4_ = (uint)(fVar83 * fVar127 - fVar143 * fVar119) & uVar43;
              auVar81._8_4_ = (uint)(fVar85 * fVar128 - fVar145 * fVar121) & uVar47;
              auVar81._12_4_ = (uint)(fVar87 * fVar129 - fVar147 * fVar123) & uVar50;
              local_808._0_4_ = ~uVar41 & (uint)(fVar99 * fVar141 - fVar116 * fVar76);
              local_808._4_4_ = ~uVar43 & (uint)(fVar103 * fVar143 - fVar118 * fVar83);
              local_808._8_4_ = ~uVar47 & (uint)(fVar105 * fVar145 - fVar120 * fVar85);
              local_808._12_4_ = ~uVar50 & (uint)(fVar107 * fVar147 - fVar122 * fVar87);
              local_808 = local_808 | auVar81;
              local_7f8[0] = (float)(~uVar42 & (uint)(fVar116 * fVar53 - fVar75 * fVar141) |
                                    (uint)(fVar141 * fVar58 - fVar53 * fVar125) & uVar42);
              local_7f8[1] = (float)(~uVar44 & (uint)(fVar118 * fVar55 - fVar82 * fVar143) |
                                    (uint)(fVar143 * fVar62 - fVar55 * fVar127) & uVar44);
              local_7f8[2] = (float)(~uVar48 & (uint)(fVar120 * fVar56 - fVar84 * fVar145) |
                                    (uint)(fVar145 * fVar63 - fVar56 * fVar128) & uVar48);
              local_7f8[3] = (float)(~uVar51 & (uint)(fVar122 * fVar57 - fVar86 * fVar147) |
                                    (uint)(fVar147 * fVar64 - fVar57 * fVar129) & uVar51);
              local_7e8[0] = (float)(~uVar46 & (uint)(fVar75 * fVar76 - fVar99 * fVar53) |
                                    (uint)(fVar53 * fVar117 - fVar76 * fVar58) & uVar46);
              local_7e8[1] = (float)(~uVar45 & (uint)(fVar82 * fVar83 - fVar103 * fVar55) |
                                    (uint)(fVar55 * fVar119 - fVar83 * fVar62) & uVar45);
              local_7e8[2] = (float)(~uVar49 & (uint)(fVar84 * fVar85 - fVar105 * fVar56) |
                                    (uint)(fVar56 * fVar121 - fVar85 * fVar63) & uVar49);
              local_7e8[3] = (float)(~uVar52 & (uint)(fVar86 * fVar87 - fVar107 * fVar57) |
                                    (uint)(fVar57 * fVar123 - fVar87 * fVar64) & uVar52);
              fVar53 = fVar108 * local_808._0_4_ +
                       fStack_ab0 * local_7f8[0] + fStack_ac4 * local_7e8[0];
              fVar55 = fVar108 * local_808._4_4_ +
                       fStack_ab0 * local_7f8[1] + fStack_ac4 * local_7e8[1];
              fVar56 = fVar108 * local_808._8_4_ +
                       fStack_ab0 * local_7f8[2] + fStack_ac4 * local_7e8[2];
              fVar108 = fVar108 * local_808._12_4_ +
                        fStack_ab0 * local_7f8[3] + fStack_ac4 * local_7e8[3];
              auVar100._0_4_ = fVar53 + fVar53;
              auVar100._4_4_ = fVar55 + fVar55;
              auVar100._8_4_ = fVar56 + fVar56;
              auVar100._12_4_ = fVar108 + fVar108;
              auVar61._0_4_ = fVar66 * local_7e8[0];
              auVar61._4_4_ = fVar71 * local_7e8[1];
              auVar61._8_4_ = fVar73 * local_7e8[2];
              auVar61._12_4_ = fVar74 * local_7e8[3];
              fVar57 = fVar124 * local_808._0_4_ + fVar114 * local_7f8[0] + auVar61._0_4_;
              fVar58 = fVar126 * local_808._4_4_ + fVar115 * local_7f8[1] + auVar61._4_4_;
              fVar62 = fStack_a30 * local_808._8_4_ + fStack_a40 * local_7f8[2] + auVar61._8_4_;
              fVar63 = fStack_a2c * local_808._12_4_ + fStack_a3c * local_7f8[3] + auVar61._12_4_;
              auVar59 = rcpps(auVar61,auVar100);
              fVar108 = auVar59._0_4_;
              fVar53 = auVar59._4_4_;
              fVar55 = auVar59._8_4_;
              fVar56 = auVar59._12_4_;
              local_818._0_4_ =
                   ((1.0 - auVar100._0_4_ * fVar108) * fVar108 + fVar108) * (fVar57 + fVar57);
              local_818._4_4_ =
                   ((1.0 - auVar100._4_4_ * fVar53) * fVar53 + fVar53) * (fVar58 + fVar58);
              local_818._8_4_ =
                   ((1.0 - auVar100._8_4_ * fVar55) * fVar55 + fVar55) * (fVar62 + fVar62);
              local_818._12_4_ =
                   ((1.0 - auVar100._12_4_ * fVar56) * fVar56 + fVar56) * (fVar63 + fVar63);
              fVar108 = ray->tfar;
              fVar53 = (ray->org).field_0.m128[3];
              auVar101._0_4_ =
                   (int)((uint)(auVar100._0_4_ != 0.0 &&
                               (local_818._0_4_ <= fVar108 && fVar53 <= local_818._0_4_)) *
                        -0x80000000) >> 0x1f;
              auVar101._4_4_ =
                   (int)((uint)(auVar100._4_4_ != 0.0 &&
                               (local_818._4_4_ <= fVar108 && fVar53 <= local_818._4_4_)) *
                        -0x80000000) >> 0x1f;
              auVar101._8_4_ =
                   (int)((uint)(auVar100._8_4_ != 0.0 &&
                               (local_818._8_4_ <= fVar108 && fVar53 <= local_818._8_4_)) *
                        -0x80000000) >> 0x1f;
              auVar101._12_4_ =
                   (int)((uint)(auVar100._12_4_ != 0.0 &&
                               (local_818._12_4_ <= fVar108 && fVar53 <= local_818._12_4_)) *
                        -0x80000000) >> 0x1f;
              iVar30 = movmskps((int)uVar37,auVar101 & auVar110);
              uVar37 = CONCAT44((int)(uVar37 >> 0x20),iVar30);
              if (iVar30 != 0) {
                local_ad8 = local_ad8 + uVar36;
                auVar28._4_4_ = fVar94;
                auVar28._0_4_ = fVar89;
                auVar28._8_4_ = fVar96;
                auVar28._12_4_ = fVar97;
                local_ab8 = context->scene;
                auVar59 = rcpps(local_818,auVar28);
                fVar108 = auVar59._0_4_;
                fVar53 = auVar59._4_4_;
                fVar55 = auVar59._8_4_;
                fVar56 = auVar59._12_4_;
                fVar108 = (float)(-(uint)(1e-18 <= ABS(fVar89)) &
                                 (uint)(((float)DAT_01feca10 - fVar89 * fVar108) * fVar108 + fVar108
                                       ));
                fVar53 = (float)(-(uint)(1e-18 <= ABS(fVar94)) &
                                (uint)((DAT_01feca10._4_4_ - fVar94 * fVar53) * fVar53 + fVar53));
                fVar55 = (float)(-(uint)(1e-18 <= ABS(fVar96)) &
                                (uint)((DAT_01feca10._8_4_ - fVar96 * fVar55) * fVar55 + fVar55));
                fVar56 = (float)(-(uint)(1e-18 <= ABS(fVar97)) &
                                (uint)((DAT_01feca10._12_4_ - fVar97 * fVar56) * fVar56 + fVar56));
                auVar92._0_4_ = fVar138 * fVar108;
                auVar92._4_4_ = fVar139 * fVar53;
                auVar92._8_4_ = fStack_a50 * fVar55;
                auVar92._12_4_ = fStack_a4c * fVar56;
                local_838 = minps(auVar92,_DAT_01feca10);
                auVar54._0_4_ = fVar108 * auVar91._0_4_;
                auVar54._4_4_ = fVar53 * auVar91._4_4_;
                auVar54._8_4_ = fVar55 * auVar91._8_4_;
                auVar54._12_4_ = fVar56 * auVar91._12_4_;
                local_828 = minps(auVar54,_DAT_01feca10);
                fStack_ac0 = fStack_ac4;
                fStack_abc = fStack_ac4;
                fStack_aac = fStack_ab0;
                do {
                  uVar38 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                  h.geomID = *(uint *)(local_ad8 + 0x120 + uVar38 * 4);
                  pGVar20 = (local_ab8->geometries).items[h.geomID].ptr;
                  if ((pGVar20->mask & ray->mask) == 0) {
                    uVar37 = uVar37 ^ 1L << (uVar38 & 0x3f);
                    bVar22 = true;
                  }
                  else {
                    pRVar21 = context->args;
                    if ((pRVar21->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar22 = false;
                    }
                    else {
                      local_a58 = (undefined4)uVar34;
                      uStack_a54 = (undefined4)(uVar34 >> 0x20);
                      h.u = *(float *)(local_838 + uVar38 * 4);
                      h.v = *(float *)(local_828 + uVar38 * 4);
                      args.context = context->user;
                      h.primID = *(uint *)(local_ad8 + 0x130 + uVar38 * 4);
                      h.Ng.field_0.field_0.x = local_7f8[uVar38 - 4];
                      h.Ng.field_0.field_0.y = local_7f8[uVar38];
                      h.Ng.field_0.field_0.z = local_7e8[uVar38];
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      local_ac8 = ray->tfar;
                      ray->tfar = *(float *)(local_818 + uVar38 * 4);
                      local_acc = -1;
                      args.valid = &local_acc;
                      args.geometryUserPtr = pGVar20->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if ((pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         (local_a48 = ray, local_a38 = context, (*pGVar20->occlusionFilterN)(&args),
                         context = local_a38, ray = local_a48, fVar137 = local_a68,
                         fVar67 = fStack_a64, fVar113 = fStack_a60, fVar133 = fStack_a5c,
                         *args.valid != 0)) {
                        if (pRVar21->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar21->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar21->filter)(&args);
                            fVar137 = local_a68;
                            fVar67 = fStack_a64;
                            fVar113 = fStack_a60;
                            fVar133 = fStack_a5c;
                          }
                          if (*args.valid == 0) goto LAB_0019aa08;
                        }
                        bVar22 = false;
                      }
                      else {
LAB_0019aa08:
                        ray->tfar = local_ac8;
                        uVar37 = uVar37 ^ 1L << (uVar38 & 0x3f);
                        bVar22 = true;
                      }
                      uVar34 = CONCAT44(uStack_a54,local_a58);
                    }
                  }
                  iVar30 = 0;
                  if (!bVar22) {
                    uVar31 = local_a80;
                    uVar38 = local_a70;
                    uVar39 = local_a78;
                    if (bVar40) {
                      ray->tfar = -INFINITY;
                      iVar30 = 3;
                    }
                    goto LAB_0019aa70;
                  }
                } while (uVar37 != 0);
                uVar37 = 0;
              }
            }
            iVar30 = 0;
            local_a10 = local_a10 + 1;
            bVar40 = local_a10 < uVar34;
            uVar31 = local_a80;
            uVar38 = local_a70;
            uVar39 = local_a78;
          } while (local_a10 != uVar34);
        }
      }
LAB_0019aa70:
      uVar37 = uVar31;
    } while (iVar30 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }